

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::field<char[12],pstack::Elf::SymbolVersioning,char>
          (JObject *this,char (*k) [12],SymbolVersioning *v,char *c)

{
  ostream *os;
  char (*local_40) [12];
  Field<char[12],_pstack::Elf::SymbolVersioning> field;
  
  local_40 = k;
  field.k = (char (*) [12])v;
  os = std::operator<<(this->os,this->sep);
  field.v = (SymbolVersioning *)&local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[12],_pstack::Elf::SymbolVersioning>,_char> *)
                        &field.v);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }